

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseNode.h
# Opt level: O1

JITJavascriptString * __thiscall CaseNode::GetUpperBoundStrConst(CaseNode *this)

{
  code *pcVar1;
  bool bVar2;
  StackSym *pSVar3;
  undefined4 *puVar4;
  JITJavascriptString *pJVar5;
  
  pSVar3 = IR::Opnd::GetStackSym((this->caseInstr->super_Instr).m_src2);
  if ((pSVar3->field_0x19 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CaseNode.h"
                       ,0x3a,"(IsUpperBoundStrConst())",
                       "Upper bound operand is not a string constant");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pSVar3 = IR::Opnd::GetStackSym((this->caseInstr->super_Instr).m_src2);
  pJVar5 = (JITJavascriptString *)StackSym::GetConstAddress(pSVar3,false);
  return pJVar5;
}

Assistant:

JITJavascriptString* GetUpperBoundStrConst()
    {
        AssertMsg(IsUpperBoundStrConst(), "Upper bound operand is not a string constant");
        return static_cast<JITJavascriptString*>(GetUpperBound()->GetStackSym()->GetConstAddress(false));
    }